

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O3

void __thiscall Diffusion::checkBeta(Diffusion *this,MultiFab **beta,int *allthere)

{
  MultiFab *pMVar1;
  int d;
  long lVar2;
  bool bVar3;
  
  *allthere = (uint)(beta != (MultiFab **)0x0);
  if (beta != (MultiFab **)0x0) {
    bVar3 = true;
    lVar2 = 0;
    do {
      while (bVar3) {
        pMVar1 = beta[lVar2];
        bVar3 = pMVar1 != (MultiFab *)0x0;
        lVar2 = lVar2 + 1;
        if (lVar2 == 3) {
          *allthere = (uint)bVar3;
          if (pMVar1 != (MultiFab *)0x0) {
            return;
          }
          goto LAB_0028a53d;
        }
      }
      lVar2 = lVar2 + 1;
      bVar3 = false;
    } while (lVar2 != 3);
    *allthere = 0;
  }
LAB_0028a53d:
  amrex::Abort_host("Diffusion::checkBeta(): beta must be all non-0");
  return;
}

Assistant:

void
Diffusion::checkBeta (const MultiFab* const* beta,
                      int&                   allthere) const
{
    allthere = beta != 0;

    if (allthere)
    {
        for (int d = 0; d < AMREX_SPACEDIM; d++)
            allthere = allthere && beta[d] != 0;
    }

    if (!allthere)
        amrex::Abort("Diffusion::checkBeta(): beta must be all non-0");
}